

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point_Object_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Point_Object_State_PDU::Encode(Point_Object_State_PDU *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  Point_Object_State_PDU *this_local;
  
  Object_State_Header::Encode(&this->super_Object_State_Header,stream);
  pKVar1 = KDataStream::operator<<(stream,(this->super_Object_State_Header).field_0x4b);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_ObjTyp).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_Loc).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_Ori).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,(DataTypeBase *)&this->m_Apperance);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16Padding);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_ReqID).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_RecvID).super_DataTypeBase);
  KDataStream::operator<<(pKVar1,this->m_ui32Padding1);
  return;
}

Assistant:

void Point_Object_State_PDU::Encode( KDataStream & stream ) const
{
    Object_State_Header::Encode( stream );

    stream << m_ModificationUnion.m_ui8Modifications
           << KDIS_STREAM m_ObjTyp
           << KDIS_STREAM m_Loc
           << KDIS_STREAM m_Ori
           << KDIS_STREAM m_Apperance
           << m_ui16Padding
           << KDIS_STREAM m_ReqID
           << KDIS_STREAM m_RecvID
           << m_ui32Padding1;
}